

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int ret;
  int is_nonce_valid;
  int local_238;
  uint local_234;
  uchar *local_230;
  uchar *local_228;
  secp256k1_context *local_220;
  secp256k1_scalar *local_218;
  secp256k1_nonce_function local_210;
  secp256k1_scalar non;
  secp256k1_modinv64_signed62 local_1e0;
  secp256k1_ge r_1;
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  secp256k1_gej rp;
  uchar b [32];
  
  ret = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  local_210 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_210 = noncefp;
  }
  local_230 = msg32;
  local_228 = seckey;
  local_234 = secp256k1_scalar_set_b32_seckey(&sec,seckey);
  secp256k1_scalar_cmov(&sec,&secp256k1_scalar_one,local_234 ^ 1);
  secp256k1_scalar_set_b32(&msg,local_230,(int *)0x0);
  uVar13 = 0;
  local_220 = ctx;
  local_218 = r;
  while( true ) {
    iVar5 = (*local_210)(nonce32,local_230,local_228,(uchar *)0x0,noncedata,uVar13);
    ret = (int)(iVar5 != 0);
    if (iVar5 == 0) break;
    is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non,nonce32);
    secp256k1_declassify(ctx,&is_nonce_valid,4);
    if (is_nonce_valid != 0) {
      local_238 = 0;
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rp,&non);
      secp256k1_ge_set_gej(&r_1,&rp);
      secp256k1_fe_impl_normalize(&r_1.x);
      secp256k1_fe_impl_normalize(&r_1.y);
      secp256k1_fe_impl_get_b32(b,&r_1.x);
      secp256k1_scalar_set_b32(r,b,&local_238);
      if (recid != (int *)0x0) {
        *recid = ((uint)r_1.y.n[0] & 1) + local_238 * 2;
      }
      secp256k1_scalar_mul(&n,r,&sec);
      secp256k1_scalar_add(&n,&n,&msg);
      local_1e0.v[0] = non.d[0] & 0x3fffffffffffffff;
      local_1e0.v[1] = (non.d[1] & 0xfffffffffffffff) << 2 | non.d[0] >> 0x3e;
      local_1e0.v[2] = (non.d[2] & 0x3ffffffffffffff) << 4 | non.d[1] >> 0x3c;
      local_1e0.v[3] = (non.d[3] & 0xffffffffffffff) << 6 | non.d[2] >> 0x3a;
      local_1e0.v[4] = non.d[3] >> 0x38;
      secp256k1_modinv64(&local_1e0,&secp256k1_const_modinfo_scalar);
      secp256k1_scalar_from_signed62(s,&local_1e0);
      secp256k1_scalar_mul(s,s,&n);
      n.d[2] = 0;
      n.d[3] = 0;
      n.d[0] = 0;
      n.d[1] = 0;
      rp.z.n[4] = 0;
      rp.infinity = 0;
      rp._124_4_ = 0;
      rp.z.n[2] = 0;
      rp.z.n[3] = 0;
      rp.z.n[0] = 0;
      rp.z.n[1] = 0;
      rp.y.n[3] = 0;
      rp.y.n[4] = 0;
      rp.y.n[1] = 0;
      rp.y.n[2] = 0;
      rp.x.n[4] = 0;
      rp.y.n[0] = 0;
      rp.x.n[2] = 0;
      rp.x.n[3] = 0;
      rp.x.n[0] = 0;
      rp.x.n[1] = 0;
      r_1.y.n[3] = 0;
      r_1.y.n[4] = 0;
      r_1.y.n[1] = 0;
      r_1.y.n[2] = 0;
      r_1.x.n[4] = 0;
      r_1.y.n[0] = 0;
      r_1.x.n[2] = 0;
      r_1.x.n[3] = 0;
      r_1.x.n[0] = 0;
      r_1.x.n[1] = 0;
      r_1.infinity = 0;
      r_1._84_4_ = 0;
      uVar6 = secp256k1_scalar_is_high(s);
      local_1e0.v[0] = CONCAT44(local_1e0.v[0]._4_4_,uVar6);
      uVar12 = -(long)(int)uVar6;
      iVar5 = secp256k1_scalar_is_zero(s);
      r = local_218;
      uVar9 = s->d[0] ^ uVar12;
      uVar10 = s->d[1] ^ uVar12;
      uVar11 = s->d[2] ^ uVar12;
      uVar1 = s->d[3];
      uVar2 = (ulong)CARRY8(uVar12 & 0xbfd25e8cd0364142,uVar9);
      uVar3 = (uVar12 & 0xbaaedce6af48a03b) + uVar10;
      uVar10 = (ulong)(CARRY8(uVar12 & 0xbaaedce6af48a03b,uVar10) || CARRY8(uVar3,uVar2));
      uVar4 = (uVar12 & 0xfffffffffffffffe) + uVar11;
      uVar8 = (ulong)(iVar5 + -1);
      s->d[0] = (uVar12 & 0xbfd25e8cd0364142) + uVar9 & uVar8;
      s->d[1] = uVar3 + uVar2 & uVar8;
      s->d[2] = uVar4 + uVar10 & uVar8;
      s->d[3] = ((uVar12 ^ uVar1) - (long)(int)uVar6) +
                (ulong)(CARRY8(uVar12 & 0xfffffffffffffffe,uVar11) || CARRY8(uVar4,uVar10)) & uVar8;
      if (recid != (int *)0x0) {
        *recid = *recid ^ uVar6;
      }
      uVar6 = secp256k1_scalar_is_zero(local_218);
      uVar7 = secp256k1_scalar_is_zero(s);
      ctx = local_220;
      ret = (uVar7 ^ 1) & ~uVar6;
      secp256k1_declassify(local_220,&ret,4);
      if (ret != 0) goto LAB_0068327f;
    }
    uVar13 = uVar13 + 1;
  }
  ret = 0;
LAB_0068327f:
  uVar13 = ret & local_234;
  nonce32[0] = '\0';
  nonce32[1] = '\0';
  nonce32[2] = '\0';
  nonce32[3] = '\0';
  nonce32[4] = '\0';
  nonce32[5] = '\0';
  nonce32[6] = '\0';
  nonce32[7] = '\0';
  nonce32[8] = '\0';
  nonce32[9] = '\0';
  nonce32[10] = '\0';
  nonce32[0xb] = '\0';
  nonce32[0xc] = '\0';
  nonce32[0xd] = '\0';
  nonce32[0xe] = '\0';
  nonce32[0xf] = '\0';
  nonce32[0x10] = '\0';
  nonce32[0x11] = '\0';
  nonce32[0x12] = '\0';
  nonce32[0x13] = '\0';
  nonce32[0x14] = '\0';
  nonce32[0x15] = '\0';
  nonce32[0x16] = '\0';
  nonce32[0x17] = '\0';
  nonce32[0x18] = '\0';
  nonce32[0x19] = '\0';
  nonce32[0x1a] = '\0';
  nonce32[0x1b] = '\0';
  nonce32[0x1c] = '\0';
  nonce32[0x1d] = '\0';
  nonce32[0x1e] = '\0';
  nonce32[0x1f] = '\0';
  msg.d[2] = 0;
  msg.d[3] = 0;
  msg.d[0] = 0;
  msg.d[1] = 0;
  non.d[2] = 0;
  non.d[3] = 0;
  non.d[0] = 0;
  non.d[1] = 0;
  sec.d[2] = 0;
  sec.d[3] = 0;
  sec.d[0] = 0;
  sec.d[1] = 0;
  uVar6 = (uint)(uVar13 == 0);
  ret = uVar13;
  secp256k1_scalar_cmov(r,&secp256k1_scalar_zero,uVar6);
  secp256k1_scalar_cmov(s,&secp256k1_scalar_zero,uVar6);
  if (recid != (int *)0x0) {
    *recid = *recid & uVar6 - 1;
  }
  return uVar13;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}